

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

int16_t place_monster(chunk *c,loc grid,monster_conflict *mon,uint8_t origin)

{
  bitflag *flags;
  undefined2 uVar1;
  undefined2 uVar2;
  _Bool _Var3;
  _Bool good;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  uint8_t uVar8;
  short sVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  uint32_t uVar12;
  monster *pmVar13;
  monster_conflict *mon_00;
  monster_conflict *pmVar14;
  monster_lore *pmVar15;
  monster_race *pmVar16;
  quest *pqVar17;
  object_kind *k;
  object *poVar18;
  monster_race *pmVar19;
  quest_artifact *arts;
  quest_artifact *pqVar20;
  artifact *paVar21;
  wchar_t idx;
  monster_drop *pmVar22;
  wchar_t wVar23;
  wchar_t wVar24;
  bool bVar25;
  
  wVar10 = mon->midx;
  _Var3 = square_in_bounds((chunk_conflict *)c,grid);
  if (!_Var3) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x6bd,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  pmVar13 = square_monster((chunk_conflict *)c,grid);
  if (pmVar13 != (monster *)0x0) {
    __assert_fail("!square_monster(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x6be,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  if (wVar10 < L'\x01') {
    sVar9 = mon_pop(c);
    if (sVar9 == 0) {
      return 0;
    }
  }
  else {
    sVar9 = (short)mon->midx;
    uVar1 = c->mon_max;
    uVar2 = c->mon_cnt;
    c->mon_max = uVar1 + 1;
    c->mon_cnt = uVar2 + 1;
  }
  idx = (wchar_t)sVar9;
  mon_00 = (monster_conflict *)cave_monster((chunk_conflict *)c,idx);
  memcpy(mon_00,mon,0x1f0);
  mon_00->midx = idx;
  square_set_mon((chunk_conflict *)c,grid,idx);
  mon_00->grid = grid;
  pmVar14 = (monster_conflict *)square_monster((chunk_conflict *)c,grid);
  if (pmVar14 != mon_00) {
    __assert_fail("square_monster(c, grid) == new_mon",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x6d4,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  monster_group_assign((chunk_conflict *)c,(monster *)mon_00,mon->group_info,L'\0' < wVar10);
  update_mon(mon_00,c,true);
  _Var3 = flag_has_dbg(mon_00->race->flags,0xc,0x17,"new_mon->race->flags","RF_MULTIPLY");
  if (_Var3) {
    c->num_repro = c->num_repro + L'\x01';
  }
  pmVar16 = mon_00->original_race;
  if (pmVar16 == (monster_race *)0x0) {
    pmVar16 = mon_00->race;
  }
  pmVar16->cur_num = pmVar16->cur_num + L'\x01';
  if (origin != '\0') {
    pmVar15 = get_lore(mon_00->race);
    pmVar16 = mon_00->original_race;
    if (pmVar16 == (monster_race *)0x0) {
      pmVar16 = mon_00->race;
    }
    flags = pmVar16->flags;
    _Var3 = flag_has_dbg(flags,0xc,0x31,"effective_race->flags","RF_DROP_GREAT");
    good = true;
    if (!_Var3) {
      good = flag_has_dbg(flags,0xc,0x30,"effective_race->flags","RF_DROP_GOOD");
    }
    _Var4 = flag_has_dbg(flags,0xc,0x29,"effective_race->flags","RF_ONLY_ITEM");
    _Var5 = flag_has_dbg(flags,0xc,0x28,"effective_race->flags","RF_ONLY_GOLD");
    wVar10 = mon_create_drop_count(pmVar16,false,false,(int *)0x0);
    _Var6 = monster_is_unique((monster *)mon_00);
    if (_Var6) {
      wVar24 = wVar10 - (uint)pmVar15->thefts;
      wVar10 = L'\0';
      if (L'\0' < wVar24) {
        wVar10 = wVar24;
      }
    }
    wVar24 = pmVar16->level;
    _Var6 = monster_is_unique((monster *)mon_00);
    wVar23 = wVar24;
    if (_Var6) {
      wVar23 = wVar24 * 2;
      if (wVar24 + L'\x0f' < wVar24 * 2) {
        wVar23 = wVar24 + L'\x0f';
      }
    }
    wVar24 = (c->depth + wVar23) / 2;
    if (wVar23 < wVar24) {
      wVar23 = wVar24;
    }
    wVar24 = L'd';
    if (wVar23 < L'd') {
      wVar24 = wVar23;
    }
    _Var7 = quest_unique_monster_check(pmVar16);
    if (((_Var7) && (pqVar17 = find_quest((int)player->place), pqVar17 != (quest *)0x0)) &&
       (pqVar20 = pqVar17->arts, pqVar20 != (quest_artifact *)0x0)) {
      for (; paVar21 = a_info, pqVar20 != (quest_artifact *)0x0; pqVar20 = pqVar20->next) {
        wVar23 = pqVar20->index;
        k = lookup_kind(a_info[wVar23].tval,a_info[wVar23].sval);
        wVar11 = Rand_div(100);
        if (wVar11 < pqVar20->chance) {
          paVar21 = paVar21 + wVar23;
          poVar18 = (object *)mem_zalloc(0x148);
          object_prep(poVar18,k,L'd',RANDOMISE);
          poVar18->artifact = paVar21;
          copy_artifact_data(poVar18,paVar21);
          mark_artifact_created(paVar21,true);
          poVar18->origin = origin;
          uVar8 = convert_depth_to_origin(c->depth);
          poVar18->origin_depth = uVar8;
          poVar18->origin_place = (int16_t)c->place;
          pmVar19 = get_origin_race(pmVar16);
          poVar18->origin_race = pmVar19;
          poVar18->number = '\x01';
          _Var7 = monster_carry(c,mon_00,poVar18);
          if (!_Var7) {
            mark_artifact_created(poVar18->artifact,false);
            object_wipe(poVar18);
            mem_free(poVar18);
          }
        }
      }
    }
    pmVar22 = (monster_drop *)&pmVar16->drops;
    while (pmVar22 = pmVar22->next, pmVar22 != (monster_drop *)0x0) {
      uVar12 = Rand_div(100);
      if (uVar12 < pmVar22->percent_chance) {
        if (pmVar22->kind == (object_kind *)0x0) {
          if (pmVar22->tval == L'\0') {
            __assert_fail("drop->tval",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                          ,0x5d6,"_Bool mon_create_drop(struct chunk *, struct monster *, uint8_t)")
            ;
          }
          poVar18 = make_object(c,wVar24,good,_Var3,_Var6,(int32_t *)0x0,pmVar22->tval);
        }
        else {
          poVar18 = (object *)mem_zalloc(0x148);
          object_prep(poVar18,pmVar22->kind,wVar24,RANDOMISE);
          apply_magic(poVar18,wVar24,true,good,_Var3,_Var6);
        }
        if (poVar18 != (object *)0x0) {
          poVar18->origin = origin;
          uVar8 = convert_depth_to_origin(c->depth);
          poVar18->origin_depth = uVar8;
          poVar18->origin_place = (int16_t)c->place;
          pmVar19 = get_origin_race(pmVar16);
          poVar18->origin_race = pmVar19;
          uVar8 = '\x01';
          if (poVar18->artifact == (artifact *)0x0) {
            uVar12 = Rand_div(pmVar22->max - pmVar22->min);
            uVar8 = (char)uVar12 + (char)pmVar22->min;
          }
          poVar18->number = uVar8;
          _Var7 = monster_carry(c,mon_00,poVar18);
          if (!_Var7) {
            object_wipe(poVar18);
            mem_free(poVar18);
          }
        }
      }
    }
    if (wVar10 < L'\x01') {
      wVar10 = L'\0';
    }
LAB_0017734b:
    bVar25 = wVar10 != L'\0';
    wVar10 = wVar10 + L'\xffffffff';
    if (bVar25) {
      if ((_Var4) || ((!_Var5 && (uVar12 = Rand_div(100), 0x31 < (int)uVar12)))) goto LAB_0017735c;
      poVar18 = make_gold(wVar24,"any");
      goto LAB_001773aa;
    }
    if (mon_00->race->mimic_kinds != (monster_mimic *)0x0) {
      mon_create_mimicked_object(c,mon_00,idx);
    }
  }
  return sVar9;
LAB_0017735c:
  poVar18 = make_object(c,wVar24,good,_Var3,_Var6,(int32_t *)0x0,L'\0');
  if (poVar18 != (object *)0x0) {
LAB_001773aa:
    poVar18->origin = origin;
    uVar8 = convert_depth_to_origin(c->depth);
    poVar18->origin_depth = uVar8;
    poVar18->origin_place = (int16_t)c->place;
    pmVar19 = get_origin_race(pmVar16);
    poVar18->origin_race = pmVar19;
    _Var7 = monster_carry(c,mon_00,poVar18);
    if (!_Var7) {
      if (poVar18->artifact != (artifact *)0x0) {
        mark_artifact_created(poVar18->artifact,false);
      }
      object_wipe(poVar18);
      mem_free(poVar18);
    }
  }
  goto LAB_0017734b;
}

Assistant:

int16_t place_monster(struct chunk *c, struct loc grid, struct monster *mon,
		uint8_t origin)
{
	int16_t m_idx;
	struct monster *new_mon;
	struct monster_group_info *info = mon->group_info;
	bool loading = mon->midx > 0;

	assert(square_in_bounds(c, grid));
	assert(!square_monster(c, grid));

	/* Get a new record, or recycle the old one */
	if (loading) {
		m_idx = mon->midx;
		c->mon_max++;
		c->mon_cnt++;
	} else {
		m_idx = mon_pop(c);
		if (!m_idx) return 0;
	}

	/* Copy the monster */
	new_mon = cave_monster(c, m_idx);
	memcpy(new_mon, mon, sizeof(struct monster));

	/* Set the ID */
	new_mon->midx = m_idx;

	/* Set the location */
	square_set_mon(c, grid, new_mon->midx);
	new_mon->grid = grid;
	assert(square_monster(c, grid) == new_mon);

	/* Assign monster to its monster group, or update its entry */
	monster_group_assign(c, new_mon, info, loading);

	update_mon(new_mon, c, true);

	/* Count the number of "reproducers" */
	if (rf_has(new_mon->race->flags, RF_MULTIPLY)) c->num_repro++;

	/* Count racial occurrences */
	if (new_mon->original_race) new_mon->original_race->cur_num++;
	else new_mon->race->cur_num++;

	/* Create the monster's drop, if any */
	if (origin)
		(void)mon_create_drop(c, new_mon, origin);

	/* Make mimics start mimicking */
	if (origin && new_mon->race->mimic_kinds) {
		mon_create_mimicked_object(c, new_mon, m_idx);
	}

	/* Result */
	return m_idx;
}